

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::PanIdQuery
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint16_t aPanId,
          string *aDstAddr)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  function<void_(ot::commissioner::Error)> *this_00;
  char *begin;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  parse_func local_1e0 [1];
  undefined1 local_1d8 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1d0;
  Error error;
  Address dstAddr;
  ByteArray channelMask;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  string local_120;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  Address::Set((Error *)local_208,&dstAddr,aDstAddr);
  pEVar3 = Error::operator=(&error,(Error *)local_208);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)&local_200);
  if (EVar1 == kNone) {
    if ((dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (*dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xff)) {
      request.mHeader._0_1_ = request.mHeader._0_1_ & 0xf3 | 4;
    }
    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
    if ((char)iVar2 == '\0') {
      local_208._0_4_ = none_type;
      local_200._M_p = "the commissioner is not active";
      local_1f8 = 0x1e;
      local_1f0._M_allocated_capacity = 0;
      local_1e0[0] = (parse_func)0x0;
      pcVar4 = "the commissioner is not active";
      local_1f0._8_8_ = local_208;
      while (begin = pcVar4, begin != "") {
        pcVar4 = begin + 1;
        if (*begin == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_208);
        }
      }
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_208;
      ::fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x2157e0,(string_view)ZEXT816(0x1e),args);
      local_1d8._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_1d0,(string *)&local_120);
      Error::operator=(&error,(Error *)local_1d8);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      std::__cxx11::string::string((string *)local_1d8,"/c/pq",(allocator *)&local_120);
      coap::Message::SetUriPath((Error *)local_208,&request,(string *)local_1d8);
      pEVar3 = Error::operator=(&error,(Error *)local_208);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)local_1d8);
      if (EVar1 == kNone) {
        iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
        tlv::Tlv::Tlv((Tlv *)local_1d8,kCommissionerSessionId,(uint16_t)iVar2,kMeshCoP);
        AppendTlv((Error *)local_208,&request,(Tlv *)local_1d8);
        pEVar3 = Error::operator=(&error,(Error *)local_208);
        EVar1 = pEVar3->mCode;
        std::__cxx11::string::~string((string *)&local_200);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d0);
        if (EVar1 == kNone) {
          MakeChannelMask((Error *)local_208,&channelMask,aChannelMask);
          pEVar3 = Error::operator=(&error,(Error *)local_208);
          EVar1 = pEVar3->mCode;
          std::__cxx11::string::~string((string *)&local_200);
          if (EVar1 == kNone) {
            tlv::Tlv::Tlv((Tlv *)local_1d8,kChannelMask,&channelMask,kMeshCoP);
            AppendTlv((Error *)local_208,&request,(Tlv *)local_1d8);
            pEVar3 = Error::operator=(&error,(Error *)local_208);
            EVar1 = pEVar3->mCode;
            std::__cxx11::string::~string((string *)&local_200);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_1d0);
            if (EVar1 == kNone) {
              tlv::Tlv::Tlv((Tlv *)local_1d8,kNetworkDiagMacAddress,aPanId,kMeshCoP);
              AppendTlv((Error *)local_208,&request,(Tlv *)local_1d8);
              pEVar3 = Error::operator=(&error,(Error *)local_208);
              EVar1 = pEVar3->mCode;
              std::__cxx11::string::~string((string *)&local_200);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_1d0);
              if (EVar1 == kNone) {
                iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
                if ((char)iVar2 != '\0') {
                  SignRequest((Error *)local_208,this,&request,kMeshCoP,true);
                  pEVar3 = Error::operator=(&error,(Error *)local_208);
                  EVar1 = pEVar3->mCode;
                  std::__cxx11::string::~string((string *)&local_200);
                  if (EVar1 != kNone) goto LAB_0019bf3f;
                }
                local_138 = (code *)0x0;
                pcStack_130 = (code *)0x0;
                local_148._M_unused._M_object = (void *)0x0;
                local_148._8_8_ = 0;
                this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
                std::function<void_(ot::commissioner::Error)>::function
                          (this_00,&onResponse.aHandler);
                pcStack_130 = std::
                              _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1213:23)>
                              ::_M_invoke;
                local_138 = std::
                            _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:1213:23)>
                            ::_M_manager;
                local_148._M_unused._M_object = this_00;
                ProxyClient::SendRequest
                          (&this->mProxyClient,&request,(ResponseHandler *)&local_148,&dstAddr,
                           0xf0bf);
                std::_Function_base::~_Function_base((_Function_base *)&local_148);
              }
            }
          }
        }
      }
    }
  }
LAB_0019bf3f:
  if ((error.mCode != kNone) || ((request.mHeader._0_1_ & 0xc) == 4)) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::PanIdQuery(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint16_t           aPanId,
                                  const std::string &aDstAddr)
{
    Error         error;
    Address       dstAddr;
    ByteArray     channelMask;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    if (dstAddr.IsMulticast())
    {
        request.SetType(coap::Type::kNonConfirmable);
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtPanidQuery));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = MakeChannelMask(channelMask, aChannelMask));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kChannelMask, channelMask}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kPanId, aPanId}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone || request.IsNonConfirmable())
    {
        aHandler(error);
    }
}